

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_20a43d::GetAndNumberControlGraphNodesDfs
               (SmallArray<VmBlock_*,_32U> *blocksPostOrder,VmBlock *block,uint *preOrder,
               uint *postOrder)

{
  VmBlock **ppVVar1;
  uint i;
  uint uVar2;
  VmBlock *local_38;
  
  uVar2 = *preOrder;
  *preOrder = uVar2 + 1;
  block->controlGraphPreOrderId = uVar2;
  block->visited = true;
  local_38 = block;
  for (uVar2 = 0; uVar2 < (block->successors).count; uVar2 = uVar2 + 1) {
    ppVVar1 = SmallArray<VmBlock_*,_4U>::operator[](&block->successors,uVar2);
    if ((*ppVVar1)->visited == false) {
      GetAndNumberControlGraphNodesDfs(blocksPostOrder,*ppVVar1,preOrder,postOrder);
    }
  }
  uVar2 = *postOrder;
  *postOrder = uVar2 + 1;
  block->controlGraphPostOrderId = uVar2;
  SmallArray<VmBlock_*,_32U>::push_back(blocksPostOrder,&local_38);
  return;
}

Assistant:

void GetAndNumberControlGraphNodesDfs(SmallArray<VmBlock*, 32>& blocksPostOrder, VmBlock* block, unsigned &preOrder, unsigned &postOrder)
	{
		block->controlGraphPreOrderId = preOrder++;

		block->visited = true;

		for(unsigned i = 0; i < block->successors.size(); i++)
		{
			VmBlock *successor = block->successors[i];

			if(!successor->visited)
				GetAndNumberControlGraphNodesDfs(blocksPostOrder, successor, preOrder, postOrder);
		}

		block->controlGraphPostOrderId = postOrder++;

		blocksPostOrder.push_back(block);
	}